

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_keyx.c
# Opt level: O0

int pkey_gost_encrypt(EVP_PKEY_CTX *pctx,uchar *out,size_t *out_len,uchar *key,size_t key_len)

{
  int function;
  void *pvVar1;
  EVP_PKEY_CTX *in_RDI;
  gost_pmeth_data *gctx;
  size_t in_stack_000000a0;
  uchar *in_stack_000000a8;
  size_t *in_stack_000000b0;
  uchar *in_stack_000000b8;
  EVP_PKEY_CTX *in_stack_000000c0;
  size_t in_stack_000010e8;
  uchar *in_stack_000010f0;
  size_t *in_stack_000010f8;
  uchar *in_stack_00001100;
  EVP_PKEY_CTX *in_stack_00001108;
  char *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  pvVar1 = EVP_PKEY_CTX_get_data(in_RDI);
  function = *(int *)((long)pvVar1 + 0x3c);
  if ((function == 0) || (function == 0x32d)) {
    local_4 = pkey_GOST_ECcp_encrypt
                        (in_stack_00001108,in_stack_00001100,in_stack_000010f8,in_stack_000010f0,
                         in_stack_000010e8);
  }
  else if ((function == 0x3f5) || (function == 0x4a4)) {
    local_4 = pkey_gost2018_encrypt
                        (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                         in_stack_000000a0);
  }
  else {
    ERR_GOST_error(function,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int pkey_gost_encrypt(EVP_PKEY_CTX *pctx, unsigned char *out,
                      size_t *out_len, const unsigned char *key, size_t key_len)
{
  struct gost_pmeth_data *gctx = EVP_PKEY_CTX_get_data(pctx);
  switch (gctx->cipher_nid)
  {
    case NID_id_Gost28147_89:
    case NID_undef: /* FIXME */
      return pkey_GOST_ECcp_encrypt(pctx, out, out_len, key, key_len);
      break;
    case NID_kuznyechik_ctr:
    case NID_magma_ctr:
      return pkey_gost2018_encrypt(pctx, out, out_len, key, key_len);
      break;
    default:
      GOSTerr(GOST_F_PKEY_GOST_ENCRYPT, ERR_R_INTERNAL_ERROR);
      return -1;
  }
}